

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::Extern::MatchImpl<wabt::interp::TableType>
          (Extern *this,Store *store,ImportType *import_type,TableType *actual,Ptr *out_trap)

{
  ExternKind EVar1;
  TableType *expected;
  Result RVar2;
  Enum EVar3;
  char *pcVar4;
  string msg;
  _Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> local_68;
  Ptr local_48;
  
  expected = (TableType *)
             (import_type->type)._M_t.
             super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
             .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl;
  EVar1 = *(ExternKind *)((long)&expected->super_ExternType + 8);
  if (expected == (TableType *)0x0 || (ulong)EVar1 != 1) {
    if (EVar1 < (Last|Table)) {
      pcVar4 = (char *)(&g_kind_name)[EVar1];
    }
    else {
      pcVar4 = "<error_kind>";
    }
    StringPrintf_abi_cxx11_
              (&msg,"expected import \"%s.%s\" to have kind %s, not %s",
               (import_type->module)._M_dataplus._M_p,(import_type->name)._M_dataplus._M_p,pcVar4,
               _DAT_001872d8);
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Trap::New(&local_48,store,&msg,
              (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)&local_68);
    out_trap->obj_ = local_48.obj_;
    out_trap->store_ = local_48.store_;
    out_trap->root_index_ = local_48.root_index_;
    local_48.obj_ = (Trap *)0x0;
    local_48.store_ = (Store *)0x0;
    local_48.root_index_ = 0;
    RefPtr<wabt::interp::Trap>::reset(&local_48);
    std::_Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::~_Vector_base
              (&local_68);
    std::__cxx11::string::_M_dispose();
    EVar3 = Error;
  }
  else {
    msg._M_dataplus._M_p = (pointer)&msg.field_2;
    msg._M_string_length = 0;
    msg.field_2._M_local_buf[0] = '\0';
    RVar2 = Match(expected,actual,&msg);
    if (RVar2.enum_ == Error) {
      local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Trap::New(&local_48,store,&msg,
                (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)&local_68);
      out_trap->obj_ = local_48.obj_;
      out_trap->store_ = local_48.store_;
      out_trap->root_index_ = local_48.root_index_;
      local_48.obj_ = (Trap *)0x0;
      local_48.store_ = (Store *)0x0;
      local_48.root_index_ = 0;
      RefPtr<wabt::interp::Trap>::reset(&local_48);
      std::_Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::~_Vector_base
                (&local_68);
    }
    EVar3 = (Enum)(RVar2.enum_ == Error);
    std::__cxx11::string::_M_dispose();
  }
  return (Result)EVar3;
}

Assistant:

Result Extern::MatchImpl(Store& store,
                         const ImportType& import_type,
                         const T& actual,
                         Trap::Ptr* out_trap) {
  const T* extern_type = dyn_cast<T>(import_type.type.get());
  if (!extern_type) {
    *out_trap = Trap::New(
        store,
        StringPrintf("expected import \"%s.%s\" to have kind %s, not %s",
                     import_type.module.c_str(), import_type.name.c_str(),
                     GetName(import_type.type->kind), GetName(T::skind)));
    return Result::Error;
  }

  std::string msg;
  if (Failed(interp::Match(*extern_type, actual, &msg))) {
    *out_trap = Trap::New(store, msg);
    return Result::Error;
  }

  return Result::Ok;
}